

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

int __thiscall amrex::BndryData::init(BndryData *this,EVP_PKEY_CTX *ctx)

{
  ulong extraout_RAX;
  ulong uVar1;
  MultiMask *smasks;
  DistributionMapping *in_stack_00000030;
  int i;
  BoxArray *in_stack_00000038;
  MultiMask *in_stack_00000040;
  MultiMask *in_stack_000000f8;
  MultiMask *in_stack_00000100;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_stack_ffffffffffffffc0;
  vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *in_stack_ffffffffffffffe0;
  uint local_14;
  
  memcpy(&this->geom,ctx + 0xba8,200);
  this->m_ncomp = *(int *)(ctx + 0xc70);
  this->m_defined = (bool)((byte)ctx[0xc74] & 1);
  LayoutData<std::array<double,_6UL>_>::operator=
            ((LayoutData<std::array<double,_6UL>_> *)in_stack_ffffffffffffffc0,
             (LayoutData<std::array<double,_6UL>_> *)in_stack_ffffffffffffffb8);
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::clear
            ((vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)0x16a3f24);
  std::vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)this);
  local_14 = 0;
  uVar1 = extraout_RAX;
  while ((int)local_14 < 6) {
    Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::operator[]
              ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)
               in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc0 =
         (LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
          *)Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::operator[]
                      ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)
                       in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    MultiMask::boxArray((MultiMask *)0x16a3f8d);
    MultiMask::DistributionMap((MultiMask *)0x16a3f9c);
    MultiMask::nComp((MultiMask *)0x16a3fab);
    MultiMask::define(in_stack_00000040,in_stack_00000038,in_stack_00000030,smasks._4_4_);
    Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::operator[]
              ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)
               in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
    MultiMask::Copy(in_stack_00000100,in_stack_000000f8);
    local_14 = local_14 + 1;
    uVar1 = (ulong)local_14;
  }
  return (int)uVar1;
}

Assistant:

void
BndryData::init (const BndryData& src)
{
    geom      = src.geom;
    m_ncomp   = src.m_ncomp;
    m_defined = src.m_defined;
    bcloc     = src.bcloc;
    bcond     = src.bcond;

    masks.clear();
    masks.resize(2*AMREX_SPACEDIM);
    for (int i = 0; i < 2*AMREX_SPACEDIM; i++)
    {
        const MultiMask& smasks = src.masks[i];
        masks[i].define(smasks.boxArray(), smasks.DistributionMap(), smasks.nComp());
        MultiMask::Copy(masks[i], smasks);
    }
}